

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QTreeWidgetItem::removeChild(QTreeWidgetItem *this,QTreeWidgetItem *child)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int index;
  long in_RAX;
  long lVar4;
  
  lVar2 = (this->children).d.size;
  if (lVar2 != 0) {
    lVar4 = -8;
    do {
      index = (int)in_RAX;
      lVar1 = lVar2 * -8 + lVar4;
      if (lVar1 == -8) goto LAB_005be07d;
      in_RAX = lVar4 + 8;
      lVar3 = lVar4 + 8;
      lVar4 = in_RAX;
    } while (*(QTreeWidgetItem **)((long)(this->children).d.ptr + lVar3) != child);
    index = (int)(in_RAX >> 3);
LAB_005be07d:
    if (lVar1 != -8) goto LAB_005be08a;
  }
  index = -1;
LAB_005be08a:
  takeChild(this,index);
  return;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }